

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

void __thiscall rw::Frame::destroy(Frame *this)

{
  Frame *pFVar1;
  ObjectWithFrame *this_00;
  Frame *pFVar2;
  Frame *local_28;
  Frame *f;
  LLLink *lnk;
  LLLink *_next;
  Frame *this_local;
  
  f = (Frame *)(this->objectList).link.next;
  while( true ) {
    pFVar2 = *(Frame **)&f->object;
    pFVar1 = (Frame *)LinkList::end(&this->objectList);
    if (f == pFVar1) break;
    this_00 = ObjectWithFrame::fromFrame((LLLink *)f);
    ObjectWithFrame::setFrame(this_00,(Frame *)0x0);
    f = pFVar2;
  }
  pFVar2 = this;
  PluginList::destruct((PluginList *)&s_plglist,this);
  pFVar1 = getParent(this);
  if (pFVar1 != (Frame *)0x0) {
    removeChild(this);
  }
  if (((this->object).privateFlags & 3) != 0) {
    LLLink::remove(&this->inDirtyList,(char *)pFVar2);
  }
  for (local_28 = this->child; local_28 != (Frame *)0x0; local_28 = local_28->next) {
    (local_28->object).parent = (void *)0x0;
  }
  (*DAT_00168638)(this);
  numAllocated = numAllocated + -1;
  return;
}

Assistant:

void
Frame::destroy(void)
{
	FORLIST(lnk, this->objectList)
		ObjectWithFrame::fromFrame(lnk)->setFrame(nil);
	s_plglist.destruct(this);
	if(this->getParent())
		this->removeChild();
	if(this->object.privateFlags & Frame::HIERARCHYSYNC)
		this->inDirtyList.remove();
	for(Frame *f = this->child; f; f = f->next)
		f->object.parent = nil;
	rwFree(this);
	numAllocated--;
}